

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O3

bool chrono::utils::WriteCheckpoint(ChSystem *system,string *filename)

{
  ostringstream *this;
  ChBody *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  int iVar10;
  ostream *poVar11;
  bool bVar12;
  double *v;
  double *pdVar13;
  pointer psVar14;
  uint uVar15;
  ulong uVar16;
  string tab;
  ChCoordsys<double> csys;
  vector<double,_std::allocator<double>_> dims;
  CSV_writer csv;
  long *local_268;
  long local_260;
  long local_258 [2];
  int local_244;
  string local_240;
  double local_220;
  double local_218;
  double local_210;
  ChBody *local_208;
  double *local_200;
  double *local_1f8;
  long local_1f0;
  CSV_writer local_1e8;
  string *local_50;
  pointer local_48;
  pointer local_40;
  ulong local_38;
  
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240," ","");
  CSV_writer::CSV_writer(&local_1e8,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  local_268 = local_258;
  local_50 = filename;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"    ","");
  local_244 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                        (system);
  this = &local_1e8.m_ss;
  poVar11 = (ostream *)std::ostream::operator<<(this,(uint)(local_244 != 0));
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
  bVar12 = SUB81(this,0);
  std::ios::widen((char)*(undefined8 *)(local_1e8._32_8_ + -0x18) + bVar12);
  std::ostream::put(bVar12);
  std::ostream::flush();
  local_48 = (system->assembly).bodylist.
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  psVar14 = (system->assembly).bodylist.
            super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar14 != local_48) {
    do {
      pCVar1 = (psVar14->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar14->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      poVar11 = (ostream *)
                std::ostream::operator<<
                          (this,(pCVar1->super_ChPhysicsItem).super_ChObj.m_identifier);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      ChBody::GetBodyFixed(pCVar1);
      poVar11 = std::ostream::_M_insert<bool>(bVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      local_40 = psVar14;
      (*(pCVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[10])(pCVar1);
      poVar11 = std::ostream::_M_insert<bool>(bVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this,(char *)local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      peVar2 = (pCVar1->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var3 = (pCVar1->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      iVar10 = (*peVar2->_vptr_ChCollisionModel[0x1e])();
      poVar11 = (ostream *)std::ostream::operator<<(this,(short)iVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      peVar2 = (pCVar1->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_01 = (pCVar1->collision_model).
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      iVar10 = (*peVar2->_vptr_ChCollisionModel[0x20])();
      poVar11 = (ostream *)std::ostream::operator<<(this,(short)iVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this,(char *)local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      poVar11 = std::ostream::_M_insert<double>((pCVar1->variables).mass);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      ChBody::GetInertiaXX(pCVar1);
      poVar11 = std::ostream::_M_insert<double>((double)local_240._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>((double)local_240._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>((double)local_240.field_2._M_allocated_capacity);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this,(char *)local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.pos.m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.pos.m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.pos.m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.rot.m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.rot.m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.rot.m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.rot.m_data[3]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this,(char *)local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                           m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                           m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                           m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.
                           m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.
                           m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.
                           m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::ostream::_M_insert<double>
                          ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.
                           m_data[3]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this,(char *)local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      std::ios::widen((char)*(undefined8 *)(local_1e8._32_8_ + -0x18) + bVar12);
      std::ostream::put(bVar12);
      std::ostream::flush();
      peVar2 = (pCVar1->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var3 = (pCVar1->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        uVar16 = (long)(peVar2->m_shapes).
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar2->m_shapes).
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
        uVar16 = (long)(peVar2->m_shapes).
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar2->m_shapes).
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      uVar15 = (uint)(uVar16 >> 4);
      poVar11 = (ostream *)std::ostream::operator<<(this,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
      std::ios::widen((char)*(undefined8 *)(local_1e8._32_8_ + -0x18) + bVar12);
      std::ostream::put(bVar12);
      std::ostream::flush();
      if (0 < (int)uVar15) {
        local_38 = (ulong)(uVar15 & 0x7fffffff);
        uVar16 = 0;
        local_208 = pCVar1;
        do {
          pCVar1 = local_208;
          peVar2 = (local_208->collision_model).
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var3 = (local_208->collision_model).
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          psVar4 = (peVar2->m_shapes).
                   super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = *(long *)&psVar4[uVar16].
                            super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
          ;
          this_02._M_pi =
               psVar4[uVar16].
               super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
            }
          }
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          peVar2 = (pCVar1->collision_model).
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var3 = (pCVar1->collision_model).
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          (*peVar2->_vptr_ChCollisionModel[0x29])(&local_240,peVar2,uVar16 & 0xffffffff);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          poVar11 = std::ostream::_M_insert<double>((double)local_240._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          poVar11 = std::ostream::_M_insert<double>((double)local_240._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          poVar11 = std::ostream::_M_insert<double>((double)local_240.field_2._M_allocated_capacity)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          poVar11 = std::ostream::_M_insert<double>((double)local_240.field_2._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          poVar11 = std::ostream::_M_insert<double>(local_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          poVar11 = std::ostream::_M_insert<double>(local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          poVar11 = std::ostream::_M_insert<double>(local_210);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this,(char *)local_268,local_260);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length);
          lVar6 = *(long *)(lVar5 + 0x10);
          p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x18);
          if (local_244 == 0) {
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
                if (__libc_single_threaded != '\0') goto LAB_0091ba22;
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
LAB_0091ba22:
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0xc));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x14));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x1c));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x20));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x24));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x28));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x2c));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x30));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this,(char *)local_268,local_260);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
          }
          else {
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
                if (__libc_single_threaded != '\0') goto LAB_0091b838;
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
LAB_0091b838:
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x1c));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x20));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0xc));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x24));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x28));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x30));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x34));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::ostream::_M_insert<double>((double)*(float *)(lVar6 + 0x3c));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this,(char *)local_268,local_260);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
          }
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          peVar2 = (local_208->collision_model).
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var3 = (local_208->collision_model).
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          (*peVar2->_vptr_ChCollisionModel[0x2a])(&local_200,peVar2,uVar16 & 0xffffffff);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          pdVar8 = local_1f8;
          pdVar7 = local_200;
          if (local_200 == local_1f8) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "utils::WriteCheckpoint ERROR: unknown or not supported collision shape\n",
                       0x47);
          }
          else {
            poVar11 = (ostream *)std::ostream::operator<<(this,*(int *)(lVar5 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1e8.m_delim._M_dataplus._M_p,local_1e8.m_delim._M_string_length
                      );
            pdVar9 = local_1f8;
            for (pdVar13 = local_200; pdVar13 != pdVar9; pdVar13 = pdVar13 + 1) {
              poVar11 = std::ostream::_M_insert<double>(*pdVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_1e8.m_delim._M_dataplus._M_p,
                         local_1e8.m_delim._M_string_length);
            }
            std::ios::widen((char)*(undefined8 *)(local_1e8._32_8_ + -0x18) + bVar12);
            std::ostream::put(bVar12);
            std::ostream::flush();
          }
          if (local_200 != (double *)0x0) {
            operator_delete(local_200,local_1f0 - (long)local_200);
          }
          if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
          }
          if (pdVar7 == pdVar8) {
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            bVar12 = false;
            goto LAB_0091bdf5;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_38);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar14 = local_40 + 1;
    } while (psVar14 != local_48);
  }
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
  CSV_writer::write_to_file(&local_1e8,local_50,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  bVar12 = true;
LAB_0091bdf5:
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  CSV_writer::~CSV_writer(&local_1e8);
  return bVar12;
}

Assistant:

bool WriteCheckpoint(ChSystem* system, const std::string& filename) {
    // Create the CSV stream.
    CSV_writer csv(" ");
    std::string tab("    ");

    // Write contact method type (0: NSC, 1: SMC)
    int ctype = (system->GetContactMethod() == ChContactMethod::NSC) ? 0 : 1;
    csv << ctype << std::endl;

    for (auto body : system->Get_bodylist()) {
        // Write body identifier, the body fixed flag, and the collide flag
        csv << body->GetIdentifier() << body->GetBodyFixed() << body->GetCollide() << tab;

        // Write collision family information.
        csv << body->GetCollisionModel()->GetFamilyGroup() << body->GetCollisionModel()->GetFamilyMask() << tab;

        // Write body mass and inertia
        csv << body->GetMass() << body->GetInertiaXX() << tab;

        // Write body position, orientation, and their time derivatives
        csv << body->GetPos() << body->GetRot() << tab;
        csv << body->GetPos_dt() << body->GetRot_dt() << tab;

        csv << std::endl;

        // Write number of collision shapes
        int n_shapes = body->GetCollisionModel()->GetNumShapes();
        csv << n_shapes << std::endl;

        // Loop over each shape and write its data on a separate line.
        // If we encounter an unsupported type, return false.
        for (int index = 0; index < n_shapes; index++) {
            auto shape = body->GetCollisionModel()->GetShape(index);

            // Write relative position and rotation
            ChCoordsys<> csys = body->GetCollisionModel()->GetShapePos(index);
            csv << csys.pos << csys.rot << tab;

            // Write shape material information
            if (ctype == 0) {
                auto mat = std::static_pointer_cast<ChMaterialSurfaceNSC>(shape->GetMaterial());
                csv << mat->static_friction << mat->sliding_friction << mat->rolling_friction << mat->spinning_friction;
                csv << mat->restitution << mat->cohesion << mat->dampingf;
                csv << mat->compliance << mat->complianceT << mat->complianceRoll << mat->complianceSpin;
                csv << tab;
            } else {
                auto mat = std::static_pointer_cast<ChMaterialSurfaceSMC>(shape->GetMaterial());
                csv << mat->young_modulus << mat->poisson_ratio;
                csv << mat->static_friction << mat->sliding_friction;
                csv << mat->restitution << mat->constant_adhesion << mat->adhesionMultDMT;
                csv << mat->kn << mat->gn << mat->kt << mat->gt;
                csv << tab;
            }

            // Write shape type and characteristic dimensions
            std::vector<double> dims = body->GetCollisionModel()->GetShapeDimensions(index);
            if (dims.empty()) {
                std::cout << "utils::WriteCheckpoint ERROR: unknown or not supported collision shape\n";
                return false;
            }

            csv << shape->GetType() << dims;

            csv << std::endl;
        }
    }

    csv.write_to_file(filename);

    return true;
}